

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

FrameEntry * __thiscall
llvm::DWARFDebugFrame::getEntryAtOffset(DWARFDebugFrame *this,uint64_t Offset)

{
  pointer puVar1;
  FrameEntry *pFVar2;
  pointer puVar3;
  FrameEntry *pFVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar3 = (this->Entries).
           super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Entries).
           super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar1 - (long)puVar3 >> 3;
  while (uVar5 = uVar6, 0 < (long)uVar5) {
    uVar6 = uVar5 >> 1;
    if ((puVar3[uVar6]._M_t.
         super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
         .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl)->Offset < Offset) {
      puVar3 = puVar3 + uVar6 + 1;
      uVar6 = ~uVar6 + uVar5;
    }
  }
  if (puVar3 == puVar1) {
    pFVar4 = (FrameEntry *)0x0;
  }
  else {
    pFVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
             .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl;
    pFVar4 = (FrameEntry *)0x0;
    if (pFVar2->Offset == Offset) {
      pFVar4 = pFVar2;
    }
  }
  return pFVar4;
}

Assistant:

FrameEntry *DWARFDebugFrame::getEntryAtOffset(uint64_t Offset) const {
  auto It = partition_point(Entries, [=](const std::unique_ptr<FrameEntry> &E) {
    return E->getOffset() < Offset;
  });
  if (It != Entries.end() && (*It)->getOffset() == Offset)
    return It->get();
  return nullptr;
}